

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O0

int encode_decode_small(test_state *state)

{
  long *plVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long in_RDI;
  bool bVar6;
  aec_stream *strm;
  size_t total_out;
  size_t avail_out;
  size_t avail_in;
  size_t n_in;
  size_t compressed_size;
  int i;
  int status;
  ulong local_40;
  ulong local_28;
  uint local_18;
  
  plVar1 = *(long **)(in_RDI + 0x58);
  iVar5 = aec_encode_init(plVar1);
  if (iVar5 != 0) {
    printf("Init failed.\n");
    return 99;
  }
  local_28 = 0;
  bVar4 = true;
  bVar3 = true;
  local_40 = 0;
  *plVar1 = *(long *)(in_RDI + 0x10);
  plVar1[1] = (long)*(int *)(in_RDI + 0xc);
  plVar1[4] = 1;
  plVar1[3] = *(long *)(in_RDI + 0x18);
  while( true ) {
    if ((bVar4) || (bVar6 = false, bVar3)) {
      bVar6 = local_40 < *(ulong *)(in_RDI + 0x38);
    }
    if (!bVar6) break;
    if ((plVar1[1] == 0) && (bVar4)) {
      local_28 = (long)*(int *)(in_RDI + 0xc) + local_28;
      if (local_28 < *(ulong *)(in_RDI + 0x30)) {
        plVar1[1] = (long)*(int *)(in_RDI + 0xc);
        *plVar1 = *(long *)(in_RDI + 0x10) + local_28;
      }
      else {
        bVar4 = false;
      }
    }
    iVar5 = aec_encode(plVar1,0);
    if (iVar5 != 0) {
      printf("Decode failed.\n");
      return 99;
    }
    if ((plVar1[5] == local_40) || (*(ulong *)(in_RDI + 0x38) <= local_40)) {
      bVar3 = false;
    }
    else {
      local_40 = plVar1[5];
      plVar1[4] = 1;
      plVar1[3] = *(long *)(in_RDI + 0x18) + local_40;
      bVar3 = true;
    }
  }
  iVar5 = aec_encode(plVar1,1);
  if (iVar5 != 0) {
    printf("Encode failed.\n");
    return 99;
  }
  aec_encode_end(plVar1);
  uVar2 = plVar1[5];
  plVar1[1] = 1;
  *plVar1 = *(long *)(in_RDI + 0x18);
  plVar1[4] = (long)*(int *)(in_RDI + 0xc);
  plVar1[3] = *(long *)(in_RDI + 0x20);
  iVar5 = aec_decode_init(plVar1);
  if (iVar5 != 0) {
    printf("Init failed.\n");
    return 99;
  }
  local_28 = 0;
  bVar4 = true;
  bVar3 = true;
  local_40 = 0;
  *plVar1 = *(long *)(in_RDI + 0x18);
  plVar1[1] = 1;
  plVar1[4] = (long)*(int *)(in_RDI + 0xc);
  plVar1[3] = *(long *)(in_RDI + 0x20);
  while( true ) {
    if ((bVar4) || (bVar6 = false, bVar3)) {
      bVar6 = local_40 < *(ulong *)(in_RDI + 0x30);
    }
    if (!bVar6) break;
    if ((plVar1[1] == 0) && (bVar4)) {
      local_28 = local_28 + 1;
      if (local_28 < uVar2) {
        plVar1[1] = 1;
        *plVar1 = *(long *)(in_RDI + 0x18) + local_28;
      }
      else {
        bVar4 = false;
      }
    }
    iVar5 = aec_decode(plVar1,0);
    if (iVar5 != 0) {
      printf("Decode failed.\n");
      return 99;
    }
    if ((plVar1[5] == local_40) || (*(ulong *)(in_RDI + 0x30) <= local_40)) {
      bVar3 = false;
    }
    else {
      local_40 = plVar1[5];
      plVar1[4] = (long)*(int *)(in_RDI + 0xc);
      plVar1[3] = *(long *)(in_RDI + 0x20) + local_40;
      bVar3 = true;
    }
  }
  iVar5 = aec_decode(plVar1,1);
  if (iVar5 != 0) {
    printf("Decode failed.\n");
    return 99;
  }
  iVar5 = memcmp(*(void **)(in_RDI + 0x10),*(void **)(in_RDI + 0x20),*(size_t *)(in_RDI + 0x28));
  if (iVar5 != 0) {
    printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
    printf("\nuncompressed buf");
    for (local_18 = 0; (int)local_18 < 0x50; local_18 = local_18 + 1) {
      if ((int)local_18 % 8 == 0) {
        printf("\n");
      }
      printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)local_18));
    }
    printf("\n\ncompressed buf len %li",uVar2);
    for (local_18 = 0; (int)local_18 < 0x50; local_18 = local_18 + 1) {
      if ((int)local_18 % 8 == 0) {
        printf("\n");
      }
      printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x18) + (long)(int)local_18));
    }
    printf("\n\ndecompressed buf");
    for (local_18 = 0; (int)local_18 < 0x50; local_18 = local_18 + 1) {
      if ((int)local_18 % 8 == 0) {
        printf("\n%04i ",(ulong)local_18);
      }
      printf("%02x ",(ulong)*(byte *)(*(long *)(in_RDI + 0x20) + (long)(int)local_18));
    }
    printf("\n");
    return 99;
  }
  aec_decode_end(plVar1);
  return 0;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    int status, i;
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %li", compressed_size);
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}